

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void aom_paeth_predictor_32x16_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 in_ZMM9 [64];
  
  auVar2 = vpmovzxbw_avx(*(undefined1 (*) [16])above);
  auVar3 = vpunpckhbw_avx(*(undefined1 (*) [16])above,(undefined1  [16])0x0);
  auVar15._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar15._16_16_ = ZEXT116(1) * auVar3;
  auVar2 = vpmovzxbw_avx(*(undefined1 (*) [16])(above + 0x10));
  auVar3 = vpunpckhbw_avx(*(undefined1 (*) [16])(above + 0x10),(undefined1  [16])0x0);
  auVar16._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar16._16_16_ = ZEXT116(1) * auVar3;
  bVar1 = above[-1];
  auVar17[1] = 0;
  auVar17[0] = bVar1;
  auVar17[2] = bVar1;
  auVar17[3] = 0;
  auVar17[4] = bVar1;
  auVar17[5] = 0;
  auVar17[6] = bVar1;
  auVar17[7] = 0;
  auVar17[8] = bVar1;
  auVar17[9] = 0;
  auVar17[10] = bVar1;
  auVar17[0xb] = 0;
  auVar17[0xc] = bVar1;
  auVar17[0xd] = 0;
  auVar17[0xe] = bVar1;
  auVar17[0xf] = 0;
  auVar17[0x10] = bVar1;
  auVar17[0x11] = 0;
  auVar17[0x12] = bVar1;
  auVar17[0x13] = 0;
  auVar17[0x14] = bVar1;
  auVar17[0x15] = 0;
  auVar17[0x16] = bVar1;
  auVar17[0x17] = 0;
  auVar17[0x18] = bVar1;
  auVar17[0x19] = 0;
  auVar17[0x1a] = bVar1;
  auVar17[0x1b] = 0;
  auVar17[0x1c] = bVar1;
  auVar17[0x1d] = 0;
  auVar17[0x1e] = bVar1;
  auVar17[0x1f] = 0;
  auVar18._16_16_ = *(undefined1 (*) [16])left;
  auVar18._0_16_ = *(undefined1 (*) [16])left;
  auVar11 = vpsubw_avx2(auVar15,auVar17);
  auVar4 = vpabsw_avx2(auVar11);
  auVar12 = vpsubw_avx2(auVar16,auVar17);
  auVar5 = vpabsw_avx2(auVar12);
  auVar19._8_8_ = 0x8000800080008000;
  auVar19._0_8_ = 0x8000800080008000;
  auVar19._16_8_ = 0x8000800080008000;
  auVar19._24_8_ = 0x8000800080008000;
  iVar14 = 0x10;
  auVar7 = vpcmpeqd_avx2(in_ZMM9._0_32_,in_ZMM9._0_32_);
  do {
    auVar10 = vpshufb_avx2(auVar18,auVar19);
    auVar6 = vpaddw_avx2(auVar10,auVar11);
    auVar13 = vpsubw_avx2(auVar6,auVar15);
    auVar13 = vpabsw_avx2(auVar13);
    auVar6 = vpsubw_avx2(auVar6,auVar17);
    auVar6 = vpabsw_avx2(auVar6);
    auVar8 = vpminsw_avx2(auVar13,auVar6);
    auVar8 = vpcmpgtw_avx2(auVar4,auVar8);
    auVar13 = vpcmpgtw_avx2(auVar13,auVar6);
    auVar6 = vpandn_avx2(auVar8,auVar10);
    auVar13 = vpblendvb_avx2(auVar15,auVar17,auVar13);
    auVar13 = vpand_avx2(auVar8,auVar13);
    auVar9 = vpor_avx2(auVar13,auVar6);
    auVar6 = vpaddw_avx2(auVar10,auVar12);
    auVar13 = vpsubw_avx2(auVar6,auVar16);
    auVar13 = vpabsw_avx2(auVar13);
    auVar6 = vpsubw_avx2(auVar6,auVar17);
    auVar6 = vpabsw_avx2(auVar6);
    auVar8 = vpminsw_avx2(auVar13,auVar6);
    auVar8 = vpcmpgtw_avx2(auVar5,auVar8);
    auVar13 = vpcmpgtw_avx2(auVar13,auVar6);
    auVar6 = vpandn_avx2(auVar8,auVar10);
    auVar13 = vpblendvb_avx2(auVar16,auVar17,auVar13);
    auVar13 = vpand_avx2(auVar8,auVar13);
    auVar13 = vpor_avx2(auVar13,auVar6);
    auVar13 = vpackuswb_avx2(auVar9,auVar13);
    auVar13 = vpermq_avx2(auVar13,0xd8);
    *(undefined1 (*) [32])dst = auVar13;
    dst = *(undefined1 (*) [32])dst + stride;
    auVar19 = vpsubw_avx2(auVar19,auVar7);
    iVar14 = iVar14 + -1;
  } while (iVar14 != 0);
  return;
}

Assistant:

void aom_paeth_predictor_32x16_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m256i l = get_left_vector(left);
  const __m256i t0 = get_top_vector(above);
  const __m256i t1 = get_top_vector(above + 16);
  const __m256i tl = _mm256_set1_epi16((int16_t)above[-1]);
  __m256i rep = _mm256_set1_epi16((short)0x8000);
  const __m256i one = _mm256_set1_epi16(1);

  int i;
  for (i = 0; i < 16; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);

    const __m256i r = paeth_32x1_pred(&l16, &t0, &t1, &tl);

    _mm256_storeu_si256((__m256i *)dst, r);

    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }
}